

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_test.cpp
# Opt level: O3

int findParam(string *param,int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  allocator<char> local_59;
  char **local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if (argc < 1) {
    iVar2 = -1;
  }
  else {
    iVar3 = -1;
    uVar4 = 1;
    local_58 = argv;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_58[uVar4 - 1],&local_59);
      plVar1 = local_50;
      if (local_48 == param->_M_string_length) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_50,(param->_M_dataplus)._M_p,local_48);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (plVar1 != local_40) {
        operator_delete(plVar1,local_40[0] + 1);
      }
      bVar5 = uVar4 < (uint)argc;
      iVar3 = iVar3 + 1;
      uVar4 = uVar4 + 1;
    } while (bVar5 && !bVar6);
    iVar2 = -1;
    if (bVar6) {
      iVar2 = iVar3;
    }
  }
  return iVar2;
}

Assistant:

int findParam ( string param,int argc,char **argv ) {
    int idx=-1;
    for ( int i=0; i<argc && idx==-1; i++ )
        if ( string ( argv[i] ) ==param ) idx=i;
    return idx;

}